

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_type.cc
# Opt level: O2

int ASN1_TYPE_set1(ASN1_TYPE *a,int type,void *value)

{
  ASN1_OBJECT *pAVar1;
  
  if (type != 1 && value != (void *)0x0) {
    if (type == 6) {
      pAVar1 = OBJ_dup((ASN1_OBJECT *)value);
      if (pAVar1 != (ASN1_OBJECT *)0x0) {
        asn1_type_cleanup((ASN1_TYPE *)a);
        a->type = 6;
        (a->value).object = pAVar1;
        return 1;
      }
      return 0;
    }
    value = ASN1_STRING_dup((ASN1_STRING *)value);
    if ((ASN1_STRING *)value == (ASN1_STRING *)0x0) {
      return 0;
    }
  }
  ASN1_TYPE_set(a,type,value);
  return 1;
}

Assistant:

int ASN1_TYPE_set1(ASN1_TYPE *a, int type, const void *value) {
  if (!value || (type == V_ASN1_BOOLEAN)) {
    void *p = (void *)value;
    ASN1_TYPE_set(a, type, p);
  } else if (type == V_ASN1_OBJECT) {
    ASN1_OBJECT *odup;
    odup = OBJ_dup(reinterpret_cast<const ASN1_OBJECT *>(value));
    if (!odup) {
      return 0;
    }
    ASN1_TYPE_set(a, type, odup);
  } else {
    ASN1_STRING *sdup;
    sdup = ASN1_STRING_dup(reinterpret_cast<const ASN1_STRING *>(value));
    if (!sdup) {
      return 0;
    }
    ASN1_TYPE_set(a, type, sdup);
  }
  return 1;
}